

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O1

astcenc_error
astcenc_decompress_image
          (astcenc_context *ctxo,uint8_t *data,size_t data_len,astcenc_image *image_outp,
          astcenc_swizzle *swizzle,uint thread_index)

{
  atomic<unsigned_int> *paVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  astcenc_error aVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint ypos;
  undefined1 auVar19 [16];
  symbolic_compressed_block scb;
  image_block blk;
  symbolic_compressed_block local_1100;
  image_block local_1080;
  
  uVar13 = (ctxo->context).thread_count;
  aVar9 = ASTCENC_ERR_BAD_PARAM;
  if (thread_index < uVar13) {
    auVar19._8_4_ = 7;
    auVar19._0_8_ = 0x700000007;
    auVar19._12_4_ = 7;
    auVar19 = vpmaxud_avx((undefined1  [16])*swizzle,auVar19);
    auVar19 = vpcmpeqd_avx((undefined1  [16])*swizzle,auVar19);
    aVar9 = ASTCENC_ERR_BAD_SWIZZLE;
    if ((((auVar19 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar19 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar19 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar19[0xf]) {
      uVar3 = (ctxo->context).config.block_x;
      uVar4 = (ctxo->context).config.block_y;
      uVar5 = (ctxo->context).config.block_z;
      uVar18 = ((image_outp->dim_x + uVar3) - 1) / uVar3;
      uVar17 = ((uVar4 + image_outp->dim_y) - 1) / uVar4;
      uVar7 = uVar17 * uVar18;
      uVar14 = (((image_outp->dim_z + uVar5) - 1) / uVar5) * uVar7;
      aVar9 = ASTCENC_ERR_OUT_OF_MEM;
      if (uVar14 * 0x10 <= data_len) {
        memset(&local_1080,0,0x1020);
        local_1080.texel_count = (char)uVar4 * (char)uVar3 * (char)uVar5;
        local_1080.decode_unorm8 = image_outp->data_type == ASTCENC_TYPE_U8;
        if (uVar13 == 1) {
          (ctxo->manage_decompress).m_init_done = false;
          (ctxo->manage_decompress).m_term_done = false;
          LOCK();
          (ctxo->manage_decompress).m_is_cancelled._M_base._M_i = false;
          UNLOCK();
          LOCK();
          (ctxo->manage_decompress).m_start_count.super___atomic_base<unsigned_int>._M_i = 0;
          UNLOCK();
          (ctxo->manage_decompress).m_done_count = 0;
          (ctxo->manage_decompress).m_task_count = 0;
          (ctxo->manage_decompress).m_callback = (astcenc_progress_callback)0x0;
          uVar2 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
          (ctxo->manage_decompress).m_callback_min_diff = (float)(int)uVar2;
          (ctxo->manage_decompress).m_callback_last_value = (float)(int)((ulong)uVar2 >> 0x20);
        }
        ParallelManager::init(&ctxo->manage_decompress,(EVP_PKEY_CTX *)(ulong)uVar14);
        do {
          LOCK();
          paVar1 = &(ctxo->manage_decompress).m_start_count;
          uVar13 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
          (paVar1->super___atomic_base<unsigned_int>)._M_i =
               (paVar1->super___atomic_base<unsigned_int>)._M_i + 0x80;
          UNLOCK();
          uVar10 = 0;
          uVar14 = 0;
          if (((ctxo->manage_decompress).m_is_cancelled._M_base._M_i & 1U) == 0) {
            uVar16 = (ctxo->manage_decompress).m_task_count;
            uVar10 = 0;
            uVar11 = uVar16 - uVar13;
            uVar14 = 0;
            if (uVar13 <= uVar16 && uVar11 != 0) {
              if (0x7f < uVar11) {
                uVar11 = 0x80;
              }
              uVar10 = (ulong)uVar13;
              uVar14 = uVar11;
            }
          }
          if (uVar14 == 0) break;
          uVar13 = uVar14;
          if ((uint)uVar10 < (uint)uVar10 + uVar14) {
            do {
              uVar6 = uVar10 % (ulong)uVar7;
              iVar8 = (int)(uVar6 / uVar18);
              iVar12 = (int)(uVar6 % (ulong)uVar18);
              iVar15 = (int)(uVar10 / uVar7);
              physical_to_symbolic
                        ((ctxo->context).bsd,
                         data + ((iVar15 * uVar17 + iVar8) * uVar18 + iVar12) * 0x10,&local_1100);
              uVar11 = iVar12 * uVar3;
              ypos = iVar8 * uVar4;
              uVar16 = iVar15 * uVar5;
              decompress_symbolic_block
                        ((ctxo->context).config.profile,(ctxo->context).bsd,uVar11,ypos,uVar16,
                         &local_1100,&local_1080);
              store_image_block(image_outp,&local_1080,(ctxo->context).bsd,uVar11,ypos,uVar16,
                                swizzle);
              uVar10 = (ulong)((int)uVar10 + 1);
              uVar13 = uVar13 - 1;
            } while (uVar13 != 0);
          }
          ParallelManager::complete_task_assignment(&ctxo->manage_decompress,uVar14);
        } while (uVar14 != 0);
        aVar9 = ASTCENC_SUCCESS;
      }
    }
  }
  return aVar9;
}

Assistant:

astcenc_error astcenc_decompress_image(
	astcenc_context* ctxo,
	const uint8_t* data,
	size_t data_len,
	astcenc_image* image_outp,
	const astcenc_swizzle* swizzle,
	unsigned int thread_index
) {
	astcenc_error status;
	astcenc_image& image_out = *image_outp;
	astcenc_contexti* ctx = &ctxo->context;

	// Today this doesn't matter (working set on stack) but might in future ...
	if (thread_index >= ctx->thread_count)
	{
		return ASTCENC_ERR_BAD_PARAM;
	}

	status = validate_decompression_swizzle(*swizzle);
	if (status != ASTCENC_SUCCESS)
	{
		return status;
	}

	unsigned int block_x = ctx->config.block_x;
	unsigned int block_y = ctx->config.block_y;
	unsigned int block_z = ctx->config.block_z;

	unsigned int xblocks = (image_out.dim_x + block_x - 1) / block_x;
	unsigned int yblocks = (image_out.dim_y + block_y - 1) / block_y;
	unsigned int zblocks = (image_out.dim_z + block_z - 1) / block_z;
	unsigned int block_count = zblocks * yblocks * xblocks;

	int row_blocks = xblocks;
	int plane_blocks = xblocks * yblocks;

	// Check we have enough output space (16 bytes per block)
	size_t size_needed = xblocks * yblocks * zblocks * 16;
	if (data_len < size_needed)
	{
		return ASTCENC_ERR_OUT_OF_MEM;
	}

	image_block blk {};
	blk.texel_count = static_cast<uint8_t>(block_x * block_y * block_z);

	// Decode mode inferred from the output data type
	blk.decode_unorm8 = image_out.data_type == ASTCENC_TYPE_U8;

	// If context thread count is one then implicitly reset
	if (ctx->thread_count == 1)
	{
		astcenc_decompress_reset(ctxo);
	}

	// Only the first thread actually runs the initializer
	ctxo->manage_decompress.init(block_count, nullptr);

	// All threads run this processing loop until there is no work remaining
	while (true)
	{
		unsigned int count;
		unsigned int base = ctxo->manage_decompress.get_task_assignment(128, count);
		if (!count)
		{
			break;
		}

		for (unsigned int i = base; i < base + count; i++)
		{
			// Decode i into x, y, z block indices
			int z = i / plane_blocks;
			unsigned int rem = i - (z * plane_blocks);
			int y = rem / row_blocks;
			int x = rem - (y * row_blocks);

			unsigned int offset = (((z * yblocks + y) * xblocks) + x) * 16;
			const uint8_t* bp = data + offset;

			symbolic_compressed_block scb;

			physical_to_symbolic(*ctx->bsd, bp, scb);

			decompress_symbolic_block(ctx->config.profile, *ctx->bsd,
			                          x * block_x, y * block_y, z * block_z,
			                          scb, blk);

			store_image_block(image_out, blk, *ctx->bsd,
			                  x * block_x, y * block_y, z * block_z, *swizzle);
		}

		ctxo->manage_decompress.complete_task_assignment(count);
	}

	return ASTCENC_SUCCESS;
}